

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  FuncState *pFVar1;
  lua_State *L;
  Proto *pPVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  TString *pTVar6;
  Proto **ppPVar7;
  long lVar8;
  int nvars;
  BlockCnt bl;
  FuncState new_fs;
  
  pFVar1 = ls->fs;
  L = ls->L;
  pPVar2 = pFVar1->f;
  lVar8 = (long)pPVar2->sizep;
  if (pPVar2->sizep <= pFVar1->np) {
    ppPVar7 = (Proto **)luaM_growaux_(L,pPVar2->p,pFVar1->np,&pPVar2->sizep,8,0x1ffff,"functions");
    pPVar2->p = ppPVar7;
    iVar5 = pPVar2->sizep;
    for (; lVar8 < iVar5; lVar8 = lVar8 + 1) {
      pPVar2->p[lVar8] = (Proto *)0x0;
    }
  }
  new_fs.f = luaF_newproto(L);
  ppPVar7 = pPVar2->p;
  iVar5 = pFVar1->np;
  pFVar1->np = iVar5 + 1;
  ppPVar7[iVar5] = new_fs.f;
  if (((pPVar2->marked & 0x20) != 0) && (((new_fs.f)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)pPVar2,(GCObject *)new_fs.f);
  }
  (new_fs.f)->linedefined = line;
  open_func(ls,&new_fs,&bl);
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar6 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar6);
    adjustlocalvars(ls,1);
  }
  pFVar1 = ls->fs;
  pPVar2 = pFVar1->f;
  iVar5 = (ls->t).token;
  bVar3 = true;
  nvars = 0;
  if (iVar5 != 0x29) {
    nvars = 0;
    while (iVar5 == 0x123) {
      pTVar6 = str_checkname(ls);
      new_localvar(ls,pTVar6);
      iVar5 = testnext(ls,0x2c);
      if (iVar5 == 0) {
        nvars = nvars + 1;
        goto LAB_00143bf2;
      }
      nvars = nvars + 1;
      iVar5 = (ls->t).token;
    }
    if (iVar5 != 0x118) {
      luaX_syntaxerror(ls,"<name> or \'...\' expected");
    }
    luaX_next(ls);
    bVar3 = false;
  }
LAB_00143bf2:
  adjustlocalvars(ls,nvars);
  bVar4 = pFVar1->nactvar;
  pPVar2->numparams = bVar4;
  if (!bVar3) {
    setvararg(pFVar1,(uint)bVar4);
    bVar4 = pFVar1->nactvar;
  }
  luaK_reserveregs(pFVar1,(uint)bVar4);
  checknext(ls,0x29);
  statlist(ls);
  (new_fs.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x105,0x108,line);
  pFVar1 = ls->fs->prev;
  iVar5 = luaK_codeABx(pFVar1,OP_CLOSURE,0,pFVar1->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOC;
  (e->u).info = iVar5;
  luaK_exp2nextreg(pFVar1,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  '(' parlist ')' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}